

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_normalize(secp256k1_fe *r)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *extraout_RDX;
  ulong uVar7;
  secp256k1_ecdsa_signature *sig;
  ulong uVar8;
  secp256k1_context *ctx;
  long lVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uchar auStack_90 [72];
  secp256k1_fe *psStack_48;
  
  secp256k1_fe_verify(r);
  uVar6 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar7 = (uVar6 >> 0x34) + r->n[1];
  uVar4 = (uVar7 >> 0x34) + r->n[2];
  uVar8 = uVar4 & 0xfffffffffffff;
  uVar4 = (uVar4 >> 0x34) + r->n[3];
  uVar5 = (uVar4 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar6 = uVar6 & 0xfffffffffffff;
  uVar12 = (ulong)(0xffffefffffc2e < uVar6 &&
                  ((uVar8 & uVar7 & uVar4) == 0xfffffffffffff && uVar5 == 0xffffffffffff)) |
           uVar5 >> 0x30;
  uVar6 = uVar12 * 0x1000003d1 + uVar6;
  uVar7 = (uVar6 >> 0x34) + (uVar7 & 0xfffffffffffff);
  sig = (secp256k1_ecdsa_signature *)((uVar7 >> 0x34) + uVar8);
  ctx = (secp256k1_context *)(((ulong)sig >> 0x34) + (uVar4 & 0xfffffffffffff));
  uVar5 = ((ulong)ctx >> 0x34) + uVar5;
  uVar4 = uVar5 >> 0x30;
  if ((uint)(ushort)(uVar5 >> 0x30) == (uint)uVar12) {
    r->n[0] = uVar6 & 0xfffffffffffff;
    r->n[1] = uVar7 & 0xfffffffffffff;
    r->n[2] = (ulong)sig & 0xfffffffffffff;
    r->n[3] = (ulong)ctx & 0xfffffffffffff;
    r->n[4] = uVar5 & 0xffffffffffff;
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_normalize_cold_1();
  auStack_90[0x30] = '\0';
  auStack_90[0x31] = '\0';
  auStack_90[0x32] = '\0';
  auStack_90[0x33] = '\0';
  auStack_90[0x34] = '\0';
  auStack_90[0x35] = '\0';
  auStack_90[0x36] = '\0';
  auStack_90[0x37] = '\0';
  auStack_90[0x38] = '\0';
  auStack_90[0x39] = '\0';
  auStack_90[0x3a] = '\0';
  auStack_90[0x3b] = '\0';
  auStack_90[0x3c] = '\0';
  auStack_90[0x3d] = '\0';
  auStack_90[0x3e] = '\0';
  auStack_90[0x3f] = '\0';
  auStack_90[0x20] = '\0';
  auStack_90[0x21] = '\0';
  auStack_90[0x22] = '\0';
  auStack_90[0x23] = '\0';
  auStack_90[0x24] = '\0';
  auStack_90[0x25] = '\0';
  auStack_90[0x26] = '\0';
  auStack_90[0x27] = '\0';
  auStack_90[0x28] = '\0';
  auStack_90[0x29] = '\0';
  auStack_90[0x2a] = '\0';
  auStack_90[0x2b] = '\0';
  auStack_90[0x2c] = '\0';
  auStack_90[0x2d] = '\0';
  auStack_90[0x2e] = '\0';
  auStack_90[0x2f] = '\0';
  auStack_90[0x10] = '\0';
  auStack_90[0x11] = '\0';
  auStack_90[0x12] = '\0';
  auStack_90[0x13] = '\0';
  auStack_90[0x14] = '\0';
  auStack_90[0x15] = '\0';
  auStack_90[0x16] = '\0';
  auStack_90[0x17] = '\0';
  auStack_90[0x18] = '\0';
  auStack_90[0x19] = '\0';
  auStack_90[0x1a] = '\0';
  auStack_90[0x1b] = '\0';
  auStack_90[0x1c] = '\0';
  auStack_90[0x1d] = '\0';
  auStack_90[0x1e] = '\0';
  auStack_90[0x1f] = '\0';
  auStack_90[0] = '\0';
  auStack_90[1] = '\0';
  auStack_90[2] = '\0';
  auStack_90[3] = '\0';
  auStack_90[4] = '\0';
  auStack_90[5] = '\0';
  auStack_90[6] = '\0';
  auStack_90[7] = '\0';
  auStack_90[8] = '\0';
  auStack_90[9] = '\0';
  auStack_90[10] = '\0';
  auStack_90[0xb] = '\0';
  auStack_90[0xc] = '\0';
  auStack_90[0xd] = '\0';
  auStack_90[0xe] = '\0';
  auStack_90[0xf] = '\0';
  psStack_48 = r;
  secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_90);
  if (((uVar4 != 0) && (uVar4 != 1)) && (*extraout_RDX == '0')) {
    bVar1 = extraout_RDX[1];
    uVar6 = 2;
    if ((char)bVar1 < '\0') {
      if (uVar4 - 2 < (ulong)bVar1 - 0x80) {
        return;
      }
      uVar6 = (ulong)bVar1 - 0x7e;
    }
    if (((uVar6 != uVar4) && (extraout_RDX[uVar6] == '\x02')) && (uVar6 + 1 != uVar4)) {
      lVar13 = uVar6 + 2;
      uVar5 = (ulong)(byte)extraout_RDX[uVar6 + 1];
      if (extraout_RDX[uVar6 + 1] < '\0') {
        uVar7 = uVar5 - 0x80;
        if (uVar4 - lVar13 < uVar7) {
          return;
        }
        if (uVar7 != 0) {
          lVar9 = uVar6 + uVar5 + -0x7e;
          uVar5 = 0;
          lVar11 = 0;
          pcVar10 = extraout_RDX;
LAB_001215b1:
          if (pcVar10[lVar13] == '\0') goto code_r0x001215b8;
          if (7 < uVar7 + lVar11) {
            return;
          }
          uVar6 = -lVar11;
          uVar5 = 0;
          do {
            uVar5 = (ulong)(byte)extraout_RDX[uVar6 + lVar13] | uVar5 << 8;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
          lVar13 = (lVar13 - lVar11) + uVar7 + lVar11;
          goto LAB_00121518;
        }
        uVar5 = 0;
        lVar9 = lVar13;
      }
      else {
LAB_00121518:
        lVar9 = lVar13;
        if (uVar4 - lVar13 < uVar5) {
          return;
        }
      }
LAB_00121523:
      uVar6 = lVar9 + uVar5;
      if (((uVar6 != uVar4) && (extraout_RDX[uVar6] == '\x02')) && (uVar6 + 1 != uVar4)) {
        lVar13 = uVar6 + 2;
        uVar7 = (ulong)(byte)extraout_RDX[uVar6 + 1];
        if (extraout_RDX[uVar6 + 1] < '\0') {
          uVar8 = uVar7 - 0x80;
          if (uVar4 - lVar13 < uVar8) {
            return;
          }
          if (uVar8 != 0) {
            lVar11 = uVar6 + uVar7 + -0x7e;
            uVar7 = 0;
            uVar6 = 0;
LAB_0012163b:
            if (extraout_RDX[uVar6 + lVar13] == '\0') goto code_r0x00121646;
            uVar12 = uVar8 - uVar6;
            if (7 < uVar12) {
              return;
            }
            lVar11 = lVar13 + uVar6;
            uVar7 = 0;
            do {
              uVar7 = (ulong)(byte)extraout_RDX[uVar6 + lVar13] | uVar7 << 8;
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
            lVar13 = lVar11 + uVar12;
            goto LAB_0012154f;
          }
          uVar7 = 0;
          lVar11 = lVar13;
        }
        else {
LAB_0012154f:
          lVar11 = lVar13;
          if (uVar4 - lVar13 < uVar7) {
            return;
          }
        }
LAB_00121557:
        bVar2 = true;
        if (uVar5 != 0) {
          uVar6 = 0;
          do {
            if (extraout_RDX[uVar6 + lVar9] != '\0') {
              if (uVar5 - uVar6 < 0x21) {
                memcpy(auStack_90 + (uVar6 - uVar5) + 0x20,extraout_RDX + uVar6 + lVar9,
                       uVar5 - uVar6);
              }
              else {
                bVar2 = false;
              }
              break;
            }
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        if (uVar7 != 0) {
          uVar6 = 0;
          do {
            if (extraout_RDX[uVar6 + lVar11] != '\0') {
              if (0x20 < uVar7 - uVar6) goto LAB_001216e7;
              memcpy(auStack_90 + (uVar6 - uVar7) + 0x40,extraout_RDX + uVar6 + lVar11,uVar7 - uVar6
                    );
              break;
            }
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
        if ((!bVar2) ||
           (iVar3 = secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_90), iVar3 == 0)) {
LAB_001216e7:
          auStack_90[0x30] = '\0';
          auStack_90[0x31] = '\0';
          auStack_90[0x32] = '\0';
          auStack_90[0x33] = '\0';
          auStack_90[0x34] = '\0';
          auStack_90[0x35] = '\0';
          auStack_90[0x36] = '\0';
          auStack_90[0x37] = '\0';
          auStack_90[0x38] = '\0';
          auStack_90[0x39] = '\0';
          auStack_90[0x3a] = '\0';
          auStack_90[0x3b] = '\0';
          auStack_90[0x3c] = '\0';
          auStack_90[0x3d] = '\0';
          auStack_90[0x3e] = '\0';
          auStack_90[0x3f] = '\0';
          auStack_90[0x20] = '\0';
          auStack_90[0x21] = '\0';
          auStack_90[0x22] = '\0';
          auStack_90[0x23] = '\0';
          auStack_90[0x24] = '\0';
          auStack_90[0x25] = '\0';
          auStack_90[0x26] = '\0';
          auStack_90[0x27] = '\0';
          auStack_90[0x28] = '\0';
          auStack_90[0x29] = '\0';
          auStack_90[0x2a] = '\0';
          auStack_90[0x2b] = '\0';
          auStack_90[0x2c] = '\0';
          auStack_90[0x2d] = '\0';
          auStack_90[0x2e] = '\0';
          auStack_90[0x2f] = '\0';
          auStack_90[0x10] = '\0';
          auStack_90[0x11] = '\0';
          auStack_90[0x12] = '\0';
          auStack_90[0x13] = '\0';
          auStack_90[0x14] = '\0';
          auStack_90[0x15] = '\0';
          auStack_90[0x16] = '\0';
          auStack_90[0x17] = '\0';
          auStack_90[0x18] = '\0';
          auStack_90[0x19] = '\0';
          auStack_90[0x1a] = '\0';
          auStack_90[0x1b] = '\0';
          auStack_90[0x1c] = '\0';
          auStack_90[0x1d] = '\0';
          auStack_90[0x1e] = '\0';
          auStack_90[0x1f] = '\0';
          auStack_90[0] = '\0';
          auStack_90[1] = '\0';
          auStack_90[2] = '\0';
          auStack_90[3] = '\0';
          auStack_90[4] = '\0';
          auStack_90[5] = '\0';
          auStack_90[6] = '\0';
          auStack_90[7] = '\0';
          auStack_90[8] = '\0';
          auStack_90[9] = '\0';
          auStack_90[10] = '\0';
          auStack_90[0xb] = '\0';
          auStack_90[0xc] = '\0';
          auStack_90[0xd] = '\0';
          auStack_90[0xe] = '\0';
          auStack_90[0xf] = '\0';
          secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_90);
        }
      }
    }
  }
  return;
code_r0x001215b8:
  lVar11 = lVar11 + -1;
  pcVar10 = pcVar10 + 1;
  if (uVar7 + lVar11 == 0) goto LAB_00121523;
  goto LAB_001215b1;
code_r0x00121646:
  uVar6 = uVar6 + 1;
  if (uVar8 == uVar6) goto LAB_00121557;
  goto LAB_0012163b;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}